

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMP_Agent.cpp
# Opt level: O2

ValueCallback * __thiscall
SNMPAgent::addReadOnlyIntegerHandler(SNMPAgent *this,char *oid,int value,bool overwritePrefix)

{
  SortableOIDType *pSVar1;
  ValueCallback *pVVar2;
  
  pSVar1 = buildOIDWithPrefix(this,oid,overwritePrefix);
  if (pSVar1 != (SortableOIDType *)0x0) {
    pVVar2 = (ValueCallback *)operator_new(0x20);
    pVVar2->OID = pSVar1;
    pVVar2->type = INTEGER;
    pVVar2->isSettable = false;
    pVVar2->setOccurred = false;
    pVVar2->_vptr_ValueCallback = (_func_int **)&PTR_buildTypeWithValue_0019af08;
    *(int *)&pVVar2[1]._vptr_ValueCallback = value;
    pVVar2 = addHandler(this,pVVar2,false);
    return pVVar2;
  }
  return (ValueCallback *)0x0;
}

Assistant:

ValueCallback* SNMPAgent::addReadOnlyIntegerHandler(const char *oid, int value, bool overwritePrefix){
    SortableOIDType* oidType = buildOIDWithPrefix(oid, overwritePrefix);
    if(!oidType) {
        return nullptr;
    }
    return addHandler(new StaticIntegerCallback(oidType, value), false);
}